

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_device_post_init(ma_device *pDevice,ma_device_type deviceType,
                             ma_device_descriptor *pDescriptorPlayback,
                             ma_device_descriptor *pDescriptorCapture)

{
  void **ppvVar1;
  ma_channel *pmVar2;
  ma_uint32 mVar3;
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var4;
  _func_void_void_ptr_void_ptr *p_Var5;
  anon_struct_1432_23_9f7d2000_for_playback *paVar6;
  ma_channel mVar7;
  uint uVar8;
  ma_device_type mVar9;
  ma_result mVar10;
  ma_result mVar11;
  ma_uint64 mVar12;
  void *pvVar13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  bool bVar18;
  ma_device_info deviceInfo;
  ma_device_info local_638;
  
  mVar11 = MA_INVALID_ARGS;
  if (pDevice == (ma_device *)0x0) {
    return MA_INVALID_ARGS;
  }
  uVar17 = deviceType - ma_device_type_capture;
  if (uVar17 < 3) {
    if (pDescriptorCapture == (ma_device_descriptor *)0x0) {
      return MA_INVALID_ARGS;
    }
    if (pDescriptorCapture->format == ma_format_unknown) {
      return MA_INVALID_ARGS;
    }
    if (pDescriptorCapture->channels - 0xff < 0xffffff02) {
      return MA_INVALID_ARGS;
    }
    if (pDescriptorCapture->sampleRate == 0) {
      return MA_INVALID_ARGS;
    }
    (pDevice->capture).internalFormat = pDescriptorCapture->format;
    (pDevice->capture).internalChannels = pDescriptorCapture->channels;
    (pDevice->capture).internalSampleRate = pDescriptorCapture->sampleRate;
    memcpy((pDevice->capture).internalChannelMap,pDescriptorCapture->channelMap,0xfe);
    mVar3 = pDescriptorCapture->periodSizeInFrames;
    (pDevice->capture).internalPeriodSizeInFrames = mVar3;
    (pDevice->capture).internalPeriods = pDescriptorCapture->periodCount;
    if (mVar3 == 0) {
      if (pDescriptorCapture->sampleRate == 0) {
        uVar8 = 0;
      }
      else {
        uVar8 = (pDescriptorCapture->sampleRate * pDescriptorCapture->periodSizeInMilliseconds) /
                1000;
      }
      (pDevice->capture).internalPeriodSizeInFrames = uVar8;
    }
  }
  mVar9 = deviceType & ~ma_device_type_capture;
  if (mVar9 == ma_device_type_playback) {
    if (pDescriptorPlayback == (ma_device_descriptor *)0x0) {
      return MA_INVALID_ARGS;
    }
    if (pDescriptorPlayback->format == ma_format_unknown) {
      return MA_INVALID_ARGS;
    }
    if (pDescriptorPlayback->channels - 0xff < 0xffffff02) {
      return MA_INVALID_ARGS;
    }
    if (pDescriptorPlayback->sampleRate == 0) {
      return MA_INVALID_ARGS;
    }
    (pDevice->playback).internalFormat = pDescriptorPlayback->format;
    (pDevice->playback).internalChannels = pDescriptorPlayback->channels;
    (pDevice->playback).internalSampleRate = pDescriptorPlayback->sampleRate;
    memcpy((pDevice->playback).internalChannelMap,pDescriptorPlayback->channelMap,0xfe);
    mVar3 = pDescriptorPlayback->periodSizeInFrames;
    (pDevice->playback).internalPeriodSizeInFrames = mVar3;
    (pDevice->playback).internalPeriods = pDescriptorPlayback->periodCount;
    if (mVar3 == 0) {
      if (pDescriptorPlayback->sampleRate == 0) {
        uVar8 = 0;
      }
      else {
        uVar8 = (pDescriptorPlayback->sampleRate * pDescriptorPlayback->periodSizeInMilliseconds) /
                1000;
      }
      (pDevice->playback).internalPeriodSizeInFrames = uVar8;
    }
  }
  if (uVar17 < 3) {
    mVar10 = ma_device_get_info(pDevice,(deviceType != ma_device_type_loopback) +
                                        ma_device_type_playback,&local_638);
    if (mVar10 == MA_SUCCESS) {
      pcVar14 = local_638.name;
    }
    else if (pDescriptorCapture->pDeviceID == (ma_device_id *)0x0) {
      pcVar14 = "Default Capture Device";
    }
    else {
      pcVar14 = "Capture Device";
    }
    ma_strncpy_s((pDevice->capture).name,0x100,pcVar14,0xffffffffffffffff);
  }
  if (mVar9 == ma_device_type_playback) {
    mVar10 = ma_device_get_info(pDevice,ma_device_type_playback,&local_638);
    if (mVar10 == MA_SUCCESS) {
      pcVar14 = local_638.name;
    }
    else if (pDescriptorPlayback->pDeviceID == (ma_device_id *)0x0) {
      pcVar14 = "Default Playback Device";
    }
    else {
      pcVar14 = "Playback Device";
    }
    ma_strncpy_s((pDevice->playback).name,0x100,pcVar14,0xffffffffffffffff);
  }
  if (uVar17 < 3) {
    if ((pDevice->capture).format == ma_format_unknown) {
      (pDevice->capture).format = (pDevice->capture).internalFormat;
    }
    if ((pDevice->capture).channels == 0) {
      (pDevice->capture).channels = (pDevice->capture).internalChannels;
    }
    if ((pDevice->capture).channelMap[0] == '\0') {
      uVar8 = (pDevice->capture).channels;
      uVar15 = (ulong)uVar8;
      if (0xfe < uVar15) {
        __assert_fail("pDevice->capture.channels <= 254",
                      "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/miniaudio.h"
                      ,0x9e99,"ma_result ma_device__post_init_setup(ma_device *, ma_device_type)");
      }
      pmVar2 = (pDevice->capture).channelMap;
      if ((pDevice->capture).internalChannels == uVar8) {
        if (uVar15 != 0) {
          memcpy(pmVar2,(pDevice->capture).internalChannelMap,uVar15);
        }
      }
      else if ((pDevice->capture).channelMixMode == ma_channel_mix_mode_simple) {
        if (uVar15 != 0) {
          memset(pmVar2,0,uVar15);
        }
      }
      else if (uVar15 != 0) {
        lVar16 = 0;
        do {
          mVar7 = ma_channel_map_init_standard_channel
                            (ma_standard_channel_map_default,uVar8,(ma_uint32)lVar16);
          pmVar2[lVar16] = mVar7;
          if (uVar8 <= (uint)(lVar16 + 1)) break;
          bVar18 = lVar16 != 0xfd;
          lVar16 = lVar16 + 1;
        } while (bVar18);
      }
    }
  }
  if (mVar9 == ma_device_type_playback) {
    if ((pDevice->playback).format == ma_format_unknown) {
      (pDevice->playback).format = (pDevice->playback).internalFormat;
    }
    if ((pDevice->playback).channels == 0) {
      (pDevice->playback).channels = (pDevice->playback).internalChannels;
    }
    if ((pDevice->playback).channelMap[0] == '\0') {
      uVar8 = (pDevice->playback).channels;
      uVar15 = (ulong)uVar8;
      if (0xfe < uVar15) {
        __assert_fail("pDevice->playback.channels <= 254",
                      "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/miniaudio.h"
                      ,0x9eae,"ma_result ma_device__post_init_setup(ma_device *, ma_device_type)");
      }
      pmVar2 = (pDevice->playback).channelMap;
      if ((pDevice->playback).internalChannels == uVar8) {
        if (uVar15 != 0) {
          memcpy(pmVar2,(pDevice->playback).internalChannelMap,uVar15);
        }
      }
      else if ((pDevice->playback).channelMixMode == ma_channel_mix_mode_simple) {
        if (uVar15 != 0) {
          memset(pmVar2,0,uVar15);
        }
      }
      else if (uVar15 != 0) {
        lVar16 = 0;
        do {
          mVar7 = ma_channel_map_init_standard_channel
                            (ma_standard_channel_map_default,uVar8,(ma_uint32)lVar16);
          pmVar2[lVar16] = mVar7;
          if (uVar8 <= (uint)(lVar16 + 1)) break;
          bVar18 = lVar16 != 0xfd;
          lVar16 = lVar16 + 1;
        } while (bVar18);
      }
    }
  }
  if (pDevice->sampleRate == 0) {
    paVar6 = &pDevice->playback;
    if (uVar17 < 3) {
      paVar6 = (anon_struct_1432_23_9f7d2000_for_playback *)&pDevice->capture;
    }
    pDevice->sampleRate = paVar6->internalSampleRate;
  }
  if (uVar17 < 3) {
    local_638.id._80_8_ = 0;
    local_638.id._72_8_ = 0;
    local_638.id._56_8_ = 0;
    local_638.id._24_8_ = (pDevice->capture).internalChannelMap;
    local_638.id._4_4_ = (pDevice->capture).format;
    local_638.id.winmm = (pDevice->capture).internalFormat;
    local_638.id._12_4_ = (pDevice->capture).channels;
    local_638.id._8_4_ = (pDevice->capture).internalChannels;
    local_638.id._20_4_ = pDevice->sampleRate;
    local_638.id._16_4_ = (pDevice->capture).internalSampleRate;
    local_638.id._32_8_ = (pDevice->capture).channelMap;
    local_638.id._40_8_ = (ulong)(pDevice->capture).channelMixMode << 0x20;
    local_638.id._52_4_ = 0;
    local_638.id._48_4_ = (pDevice->capture).calculateLFEFromSpatialChannels;
    local_638.id._64_8_ = 0;
    local_638.id._92_4_ = 0;
    local_638.id._88_4_ = (pDevice->resampling).algorithm;
    local_638.id._116_4_ = 0;
    local_638.id._112_4_ = (pDevice->resampling).linear.lpfOrder;
    local_638.id._96_8_ = (pDevice->resampling).pBackendVTable;
    local_638.id._104_8_ = (pDevice->resampling).pBackendUserData;
    if ((pDevice->state).value != ma_device_state_uninitialized) {
      ma_data_converter_uninit
                (&(pDevice->capture).converter,&pDevice->pContext->allocationCallbacks);
    }
    mVar11 = ma_data_converter_init
                       ((ma_data_converter_config *)&local_638,
                        &pDevice->pContext->allocationCallbacks,&(pDevice->capture).converter);
    if (mVar11 != MA_SUCCESS) {
      return mVar11;
    }
  }
  if (mVar9 == ma_device_type_playback) {
    local_638.id._80_8_ = 0;
    local_638.id._72_8_ = 0;
    local_638.id._56_8_ = 0;
    local_638.id._24_8_ = (pDevice->playback).channelMap;
    local_638.id._4_4_ = (pDevice->playback).internalFormat;
    local_638.id.winmm = (pDevice->playback).format;
    local_638.id._12_4_ = (pDevice->playback).internalChannels;
    local_638.id._8_4_ = (pDevice->playback).channels;
    local_638.id._20_4_ = (pDevice->playback).internalSampleRate;
    local_638.id._16_4_ = pDevice->sampleRate;
    local_638.id._32_8_ = (pDevice->playback).internalChannelMap;
    local_638.id._40_8_ = (ulong)(pDevice->playback).channelMixMode << 0x20;
    local_638.id._52_4_ = 0;
    local_638.id._48_4_ = (pDevice->playback).calculateLFEFromSpatialChannels;
    local_638.id._64_8_ = 0;
    local_638.id._92_4_ = 0;
    local_638.id._88_4_ = (pDevice->resampling).algorithm;
    local_638.id._116_4_ = 0;
    local_638.id._112_4_ = (pDevice->resampling).linear.lpfOrder;
    local_638.id._96_8_ = (pDevice->resampling).pBackendVTable;
    local_638.id._104_8_ = (pDevice->resampling).pBackendUserData;
    if ((pDevice->state).value != ma_device_state_uninitialized) {
      ma_data_converter_uninit
                (&(pDevice->playback).converter,&pDevice->pContext->allocationCallbacks);
    }
    mVar10 = ma_data_converter_init
                       ((ma_data_converter_config *)&local_638,
                        &pDevice->pContext->allocationCallbacks,&(pDevice->playback).converter);
    if (mVar10 != MA_SUCCESS) {
      return mVar10;
    }
  }
  if (mVar9 != ma_device_type_playback) {
    return MA_SUCCESS;
  }
  (pDevice->playback).inputCacheConsumed = 0;
  (pDevice->playback).inputCacheRemaining = 0;
  if ((pDevice->type == ma_device_type_duplex) ||
     (mVar10 = ma_data_converter_get_required_input_frame_count
                         (&(pDevice->playback).converter,1,(ma_uint64 *)&local_638),
     mVar10 != MA_SUCCESS)) {
    mVar12 = ma_calculate_frame_count_after_resampling
                       ((pDevice->playback).internalSampleRate,pDevice->sampleRate,
                        (ulong)(pDevice->playback).internalPeriodSizeInFrames);
    uVar15 = ((&DAT_001d0e20)[(pDevice->playback).format] * (pDevice->playback).channels) * mVar12;
    ppvVar1 = &(pDevice->playback).pInputCache;
    if (uVar15 >> 0x20 == 0) {
      p_Var4 = (pDevice->pContext->allocationCallbacks).onRealloc;
      if (p_Var4 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
        pvVar13 = (void *)0x0;
      }
      else {
        pvVar13 = (*p_Var4)(*ppvVar1,uVar15,(pDevice->pContext->allocationCallbacks).pUserData);
      }
      if (pvVar13 != (void *)0x0) {
        (pDevice->playback).pInputCache = pvVar13;
        (pDevice->playback).inputCacheCap = mVar12;
        goto LAB_0010d5d9;
      }
    }
    pvVar13 = (pDevice->playback).pInputCache;
    if (pvVar13 != (void *)0x0) {
      p_Var5 = (pDevice->pContext->allocationCallbacks).onFree;
      if (p_Var5 != (_func_void_void_ptr_void_ptr *)0x0) {
        (*p_Var5)(pvVar13,(pDevice->pContext->allocationCallbacks).pUserData);
      }
    }
    *ppvVar1 = (void *)0x0;
    (pDevice->playback).inputCacheCap = 0;
    mVar11 = MA_OUT_OF_MEMORY;
    bVar18 = false;
  }
  else {
    pvVar13 = (pDevice->playback).pInputCache;
    if (pvVar13 != (void *)0x0) {
      p_Var5 = (pDevice->pContext->allocationCallbacks).onFree;
      if (p_Var5 != (_func_void_void_ptr_void_ptr *)0x0) {
        (*p_Var5)(pvVar13,(pDevice->pContext->allocationCallbacks).pUserData);
      }
    }
    (pDevice->playback).pInputCache = (void *)0x0;
    (pDevice->playback).inputCacheCap = 0;
LAB_0010d5d9:
    bVar18 = true;
  }
  if (bVar18) {
    return MA_SUCCESS;
  }
  return mVar11;
}

Assistant:

MA_API ma_result ma_device_post_init(ma_device* pDevice, ma_device_type deviceType, const ma_device_descriptor* pDescriptorPlayback, const ma_device_descriptor* pDescriptorCapture)
{
    ma_result result;

    if (pDevice == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Capture. */
    if (deviceType == ma_device_type_capture || deviceType == ma_device_type_duplex || deviceType == ma_device_type_loopback) {
        if (ma_device_descriptor_is_valid(pDescriptorCapture) == MA_FALSE) {
            return MA_INVALID_ARGS;
        }

        pDevice->capture.internalFormat             = pDescriptorCapture->format;
        pDevice->capture.internalChannels           = pDescriptorCapture->channels;
        pDevice->capture.internalSampleRate         = pDescriptorCapture->sampleRate;
        MA_COPY_MEMORY(pDevice->capture.internalChannelMap, pDescriptorCapture->channelMap, sizeof(pDescriptorCapture->channelMap));
        pDevice->capture.internalPeriodSizeInFrames = pDescriptorCapture->periodSizeInFrames;
        pDevice->capture.internalPeriods            = pDescriptorCapture->periodCount;

        if (pDevice->capture.internalPeriodSizeInFrames == 0) {
            pDevice->capture.internalPeriodSizeInFrames = ma_calculate_buffer_size_in_frames_from_milliseconds(pDescriptorCapture->periodSizeInMilliseconds, pDescriptorCapture->sampleRate);
        }
    }

    /* Playback. */
    if (deviceType == ma_device_type_playback || deviceType == ma_device_type_duplex) {
        if (ma_device_descriptor_is_valid(pDescriptorPlayback) == MA_FALSE) {
            return MA_INVALID_ARGS;
        }

        pDevice->playback.internalFormat             = pDescriptorPlayback->format;
        pDevice->playback.internalChannels           = pDescriptorPlayback->channels;
        pDevice->playback.internalSampleRate         = pDescriptorPlayback->sampleRate;
        MA_COPY_MEMORY(pDevice->playback.internalChannelMap, pDescriptorPlayback->channelMap, sizeof(pDescriptorPlayback->channelMap));
        pDevice->playback.internalPeriodSizeInFrames = pDescriptorPlayback->periodSizeInFrames;
        pDevice->playback.internalPeriods            = pDescriptorPlayback->periodCount;

        if (pDevice->playback.internalPeriodSizeInFrames == 0) {
            pDevice->playback.internalPeriodSizeInFrames = ma_calculate_buffer_size_in_frames_from_milliseconds(pDescriptorPlayback->periodSizeInMilliseconds, pDescriptorPlayback->sampleRate);
        }
    }

    /*
    The name of the device can be retrieved from device info. This may be temporary and replaced with a `ma_device_get_info(pDevice, deviceType)` instead.
    For loopback devices, we need to retrieve the name of the playback device.
    */
    {
        ma_device_info deviceInfo;

        if (deviceType == ma_device_type_capture || deviceType == ma_device_type_duplex || deviceType == ma_device_type_loopback) {
            result = ma_device_get_info(pDevice, (deviceType == ma_device_type_loopback) ? ma_device_type_playback : ma_device_type_capture, &deviceInfo);
            if (result == MA_SUCCESS) {
                ma_strncpy_s(pDevice->capture.name, sizeof(pDevice->capture.name), deviceInfo.name, (size_t)-1);
            } else {
                /* We failed to retrieve the device info. Fall back to a default name. */
                if (pDescriptorCapture->pDeviceID == NULL) {
                    ma_strncpy_s(pDevice->capture.name, sizeof(pDevice->capture.name), MA_DEFAULT_CAPTURE_DEVICE_NAME, (size_t)-1);
                } else {
                    ma_strncpy_s(pDevice->capture.name, sizeof(pDevice->capture.name), "Capture Device", (size_t)-1);
                }
            }
        }

        if (deviceType == ma_device_type_playback || deviceType == ma_device_type_duplex) {
            result = ma_device_get_info(pDevice, ma_device_type_playback, &deviceInfo);
            if (result == MA_SUCCESS) {
                ma_strncpy_s(pDevice->playback.name, sizeof(pDevice->playback.name), deviceInfo.name, (size_t)-1);
            } else {
                /* We failed to retrieve the device info. Fall back to a default name. */
                if (pDescriptorPlayback->pDeviceID == NULL) {
                    ma_strncpy_s(pDevice->playback.name, sizeof(pDevice->playback.name), MA_DEFAULT_PLAYBACK_DEVICE_NAME, (size_t)-1);
                } else {
                    ma_strncpy_s(pDevice->playback.name, sizeof(pDevice->playback.name), "Playback Device", (size_t)-1);
                }
            }
        }
    }

    /* Update data conversion. */
    return ma_device__post_init_setup(pDevice, deviceType); /* TODO: Should probably rename ma_device__post_init_setup() to something better. */
}